

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

uint LinearScan::GetUseSpillCost(uint loopNest,BOOL isInHelperBlock)

{
  BOOL isInHelperBlock_local;
  uint loopNest_local;
  
  if (isInHelperBlock == 0) {
    if (loopNest < 6) {
      isInHelperBlock_local = 1 << ((char)loopNest * '\x03' & 0x1fU);
    }
    else {
      isInHelperBlock_local = (loopNest - 5) * 0x8000;
    }
  }
  else {
    isInHelperBlock_local = 0;
  }
  return isInHelperBlock_local;
}

Assistant:

uint
LinearScan::GetUseSpillCost(uint loopNest, BOOL isInHelperBlock)
{
    if (isInHelperBlock)
    {
        // Helper block uses are not as important.
        return 0;
    }
    else if (loopNest < 6)
    {
        return (1 << (loopNest * 3));
    }
    else
    {
        // Slow growth for deep nest to avoid overflow
        return (1 << (5 * 3)) * (loopNest-5);
    }
}